

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_manager::remove_request(tracker_manager *this,http_tracker_connection *c)

{
  counters *pcVar1;
  bool bVar2;
  reference __r;
  __shared_ptr_access<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  size_type sVar4;
  iterator local_138;
  const_iterator local_118;
  iterator local_f8;
  shared_ptr<libtorrent::aux::http_tracker_connection> *local_d8;
  iterator local_d0;
  iterator local_b0;
  undefined1 local_90 [8];
  _Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_&,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_*>
  j;
  undefined1 local_60 [8];
  type conn;
  const_iterator local_48;
  __normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>_>
  local_40;
  shared_ptr<libtorrent::aux::http_tracker_connection> *local_38;
  shared_ptr<libtorrent::aux::http_tracker_connection> *local_30;
  __normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>_>
  i;
  http_tracker_connection *c_local;
  tracker_manager *this_local;
  
  i._M_current = (shared_ptr<libtorrent::aux::http_tracker_connection> *)c;
  local_28._M_current =
       (shared_ptr<libtorrent::aux::http_tracker_connection> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ::begin(&this->m_http_conns);
  local_30 = (shared_ptr<libtorrent::aux::http_tracker_connection> *)
             ::std::
             vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
             ::end(&this->m_http_conns);
  local_38 = i._M_current;
  local_20 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>*,std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>>,libtorrent::aux::tracker_manager::remove_request(libtorrent::aux::http_tracker_connection_const*)::__0>
                       (local_28,(__normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>_>
                                  )local_30,(anon_class_8_1_54a39803_for__M_pred)i._M_current);
  local_40._M_current =
       (shared_ptr<libtorrent::aux::http_tracker_connection> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ::end(&this->m_http_conns);
  bVar2 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar2) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>const*,std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>>
    ::__normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>*>
              ((__normal_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>const*,std::vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>>
                *)&local_48,&local_20);
    conn.super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::std::
         vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
         ::erase(&this->m_http_conns,local_48);
    bVar2 = ::std::
            deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
            ::empty(&this->m_queued);
    if (!bVar2) {
      __r = ::std::
            deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
            ::front(&this->m_queued);
      ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::shared_ptr
                ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_60,__r);
      ::std::
      deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::pop_front(&this->m_queued);
      ::std::
      vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::push_back(&this->m_http_conns,
                  (shared_ptr<libtorrent::aux::http_tracker_connection> *)local_60);
      this_00 = (__shared_ptr_access<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)::std::
                   vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                   ::back(&this->m_http_conns);
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      (*(peVar3->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[3])();
      pcVar1 = this->m_stats_counters;
      sVar4 = ::std::
              deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ::size(&this->m_queued);
      counters::set_value(pcVar1,0x122,sVar4);
      ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::~shared_ptr
                ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_60);
    }
  }
  else {
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::begin(&local_b0,&this->m_queued);
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::end(&local_d0,&this->m_queued);
    local_d8 = i._M_current;
    ::std::
    find_if<std::_Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::shared_ptr<libtorrent::aux::http_tracker_connection>&,std::shared_ptr<libtorrent::aux::http_tracker_connection>*>,libtorrent::aux::tracker_manager::remove_request(libtorrent::aux::http_tracker_connection_const*)::__1>
              ((_Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_&,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_*>
                *)local_90,&local_b0,&local_d0,(anon_class_8_1_54a39803_for__M_pred)i._M_current);
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::end(&local_f8,&this->m_queued);
    bVar2 = ::std::operator!=((_Self *)local_90,&local_f8);
    if (bVar2) {
      ::std::
      _Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::shared_ptr<libtorrent::aux::http_tracker_connection>const&,std::shared_ptr<libtorrent::aux::http_tracker_connection>const*>
      ::
      _Deque_iterator<std::_Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::shared_ptr<libtorrent::aux::http_tracker_connection>&,std::shared_ptr<libtorrent::aux::http_tracker_connection>*>,void>
                ((_Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::shared_ptr<libtorrent::aux::http_tracker_connection>const&,std::shared_ptr<libtorrent::aux::http_tracker_connection>const*>
                  *)&local_118,
                 (_Deque_iterator<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_&,_std::shared_ptr<libtorrent::aux::http_tracker_connection>_*>
                  *)local_90);
      ::std::
      deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::erase(&local_138,&this->m_queued,&local_118);
      pcVar1 = this->m_stats_counters;
      sVar4 = ::std::
              deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ::size(&this->m_queued);
      counters::set_value(pcVar1,0x122,sVar4);
    }
  }
  return;
}

Assistant:

void tracker_manager::remove_request(aux::http_tracker_connection const* c)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_http_conns.begin(), m_http_conns.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (i != m_http_conns.end())
		{
			m_http_conns.erase(i);
			if (!m_queued.empty())
			{
				auto conn = std::move(m_queued.front());
				m_queued.pop_front();
				m_http_conns.push_back(std::move(conn));
				m_http_conns.back()->start();
				m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
			}
			return;
		}

		auto const j = std::find_if(m_queued.begin(), m_queued.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (j != m_queued.end())
		{
			m_queued.erase(j);
			m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
		}
	}